

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O0

int llmsset_mark(llmsset_t dbs,uint64_t index)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  ulong uVar4;
  uint64_t v;
  uint64_t mask;
  uint64_t *ptr;
  uint64_t index_local;
  llmsset_t dbs_local;
  
  puVar3 = dbs->bitmap2 + (index >> 6);
  uVar4 = 0x8000000000000000 >> ((byte)index & 0x3f);
  do {
    uVar2 = *puVar3;
    if ((uVar2 & uVar4) != 0) {
      return 0;
    }
    LOCK();
    uVar1 = *puVar3;
    if (uVar2 == uVar1) {
      *puVar3 = uVar2 | uVar4;
    }
    UNLOCK();
  } while (uVar2 != uVar1);
  return 1;
}

Assistant:

int
llmsset_mark(const llmsset_t dbs, uint64_t index)
{
    _Atomic(uint64_t)* ptr = dbs->bitmap2 + (index/64);
    uint64_t mask = 0x8000000000000000LL >> (index&63);
    for (;;) {
        uint64_t v = *ptr;
        if (v & mask) return 0;
        if (atomic_compare_exchange_weak(ptr, &v, v|mask)) return 1;
    }
}